

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O3

int __thiscall
ncnn::Yolov3DetectionOutput::forward
          (Yolov3DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  pointer pMVar1;
  size_t sVar2;
  void *pvVar3;
  iterator __position;
  Mat *this_01;
  undefined8 uVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar13;
  int iVar14;
  undefined4 *puVar15;
  int iVar16;
  ulong uVar17;
  BBoxRect *__args;
  float *pfVar18;
  float *pfVar19;
  pointer piVar20;
  undefined4 uVar21;
  ulong uVar22;
  Yolov3DetectionOutput *this_02;
  uint _h;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  float *pfVar27;
  float fVar28;
  float extraout_XMM0_Db;
  undefined1 auVar29 [12];
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  undefined1 local_1b8 [8];
  BBoxRect *pBStack_1b0;
  BBoxRect *local_1a8;
  void *local_198;
  long local_190;
  undefined1 local_188 [32];
  undefined1 local_168 [32];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  pointer local_130;
  pointer local_128;
  float *local_120;
  pointer local_118;
  Yolov3DetectionOutput *local_110;
  float local_108;
  float fStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined1 local_f8 [16];
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_e0;
  Option *local_d8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_d0;
  size_t local_c8;
  long local_c0;
  pointer local_b8;
  long local_b0;
  void *local_a8;
  pointer local_a0;
  void *local_98;
  float *local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [12];
  float fStack_5c;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_168._0_8_ = (pointer)0x0;
  local_168._8_8_ = (pointer)0x0;
  local_168._16_8_ = 0;
  this_02 = this;
  local_e0 = top_blobs;
  local_d8 = opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_198 = (void *)0x0;
    local_110 = this;
    local_d0 = bottom_blobs;
    do {
      pvVar13 = local_d0;
      local_1b8 = (undefined1  [8])0x0;
      pBStack_1b0 = (BBoxRect *)0x0;
      local_1a8 = (BBoxRect *)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                *)local_1b8,(long)this_02->num_box);
      pMVar1 = (pvVar13->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar16 = this_02->num_box;
      iVar14 = pMVar1[(long)local_198].c / iVar16;
      if (iVar14 != this_02->num_class + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   *)local_1b8);
        iVar16 = -1;
        goto LAB_00448ff4;
      }
      if (0 < iVar16) {
        local_b8 = pMVar1 + (long)local_198;
        uVar25._0_4_ = local_b8->w;
        uVar25._4_4_ = local_b8->h;
        fVar28 = *(float *)((long)(this_02->anchors_scale).data + (long)local_198 * 4);
        local_130 = (pointer)(ulong)(uint)uVar25._4_4_;
        local_128 = (pointer)(uVar25 & 0xffffffff);
        local_88 = (float)(int)(fVar28 * (float)(int)(undefined4)uVar25);
        fStack_84 = (float)(int)(fVar28 * (float)(int)uVar25._4_4_);
        fStack_80 = (float)(int)(fVar28 * 0.0);
        fStack_7c = (float)(int)(fVar28 * 0.0);
        local_c8 = (size_t)iVar14;
        uVar4 = CONCAT44((float)(int)uVar25._4_4_,(float)(int)(undefined4)uVar25);
        local_68._8_4_ = 0x3f000000;
        local_68._0_8_ = uVar4;
        fStack_5c = 0.5;
        auVar33._8_4_ = 0x3f000000;
        auVar33._0_8_ = uVar4;
        auVar33._12_4_ = 0x3f000000;
        local_78 = divps(_DAT_005a4a20,auVar33);
        local_c0 = (long)iVar16 * (long)local_198 * 4;
        local_190 = 0;
        do {
          if (0 < (int)local_130) {
            lVar26 = local_190 * local_c8;
            sVar2 = local_b8->cstep;
            pvVar3 = local_b8->data;
            uVar25 = local_b8->elemsize;
            local_a8 = (void *)((lVar26 + 5) * sVar2 * uVar25 + (long)pvVar3);
            local_b0 = (long)local_b8->w * uVar25;
            uVar23 = (long)local_b8->d * (long)local_b8->h * local_b0 + 0xfU & 0xfffffffffffffff0;
            pfVar18 = (float *)((lVar26 + 4) * sVar2 * uVar25 + (long)pvVar3);
            local_118 = (pointer)((lVar26 + 3) * sVar2 * uVar25 + (long)pvVar3);
            local_120 = (float *)((lVar26 + 2) * sVar2 * uVar25 + (long)pvVar3);
            pfVar19 = (float *)((lVar26 + 1) * sVar2 * uVar25 + (long)pvVar3);
            pfVar27 = (float *)(lVar26 * sVar2 * uVar25 + (long)pvVar3);
            local_58._8_8_ =
                 *(undefined8 *)
                  ((long)(this_02->biases).data +
                  (long)((int)*(float *)((long)(this_02->mask).data + local_190 * 4 + local_c0) * 2)
                  * 4);
            local_58._0_8_ = 0x3f8000003f800000;
            piVar20 = (pointer)0x0;
            do {
              local_a0 = piVar20;
              if (0 < (int)local_128) {
                local_48 = (float)(int)piVar20;
                local_98 = (void *)(local_b0 * (long)piVar20 + (long)local_a8);
                fStack_40 = local_88;
                fStack_3c = fStack_84;
                piVar20 = (pointer)0x0;
                fStack_44 = local_48;
                do {
                  if ((long)this_02->num_class < 1) {
                    uVar21 = 0;
                    auVar29 = ZEXT812(0xff7fffff);
                  }
                  else {
                    uVar17 = 0;
                    uVar22 = 0;
                    auVar29 = ZEXT812(0xff7fffff);
                    do {
                      fVar28 = *(float *)((long)local_98 +
                                         (uVar23 - uVar23 % uVar25) * uVar17 + (long)piVar20 * 4);
                      fVar36 = auVar29._0_4_;
                      if (fVar36 < fVar28) {
                        uVar22 = uVar17 & 0xffffffff;
                      }
                      uVar21 = (undefined4)uVar22;
                      if (fVar28 <= fVar36) {
                        fVar28 = fVar36;
                      }
                      auVar29._4_8_ = 0;
                      auVar29._0_4_ = fVar28;
                      uVar17 = uVar17 + 1;
                    } while ((long)this_02->num_class != uVar17);
                  }
                  local_f8._12_4_ = 0;
                  local_f8._0_12_ = auVar29;
                  local_148 = expf(-*pfVar18);
                  fVar28 = expf(-local_f8._0_4_);
                  fVar28 = 1.0 / ((fVar28 + 1.0) * local_148 + 1.0);
                  if (local_110->confidence_threshold <= fVar28) {
                    local_108 = -*pfVar27;
                    fStack_104 = -*pfVar19;
                    uStack_100 = 0x80000000;
                    uStack_fc = 0x80000000;
                    local_f8._0_4_ = fVar28;
                    local_90 = pfVar18;
                    local_148 = expf(local_108);
                    fStack_144 = extraout_XMM0_Db;
                    fVar28 = expf(fStack_104);
                    local_148 = local_148 + 1.0;
                    fStack_140 = fStack_144 + 0.0;
                    fStack_13c = extraout_XMM0_Db_00 + 0.0;
                    fStack_144 = fVar28 + 1.0;
                    local_108 = expf(*local_120);
                    fStack_104 = (float)extraout_XMM0_Db_01;
                    fVar28 = expf(*(float *)&local_118->data);
                    local_188._0_4_ = local_f8._0_4_;
                    auVar5._8_4_ = fStack_104;
                    auVar5._4_4_ = local_108;
                    auVar5._0_4_ = extraout_XMM0_Db_02;
                    auVar30._0_8_ = auVar5._0_8_ << 0x20;
                    auVar30._8_4_ = local_108;
                    auVar30._12_4_ = fVar28;
                    auVar8._4_4_ = fStack_144;
                    auVar8._0_4_ = local_148;
                    auVar8._8_4_ = fStack_140;
                    auVar8._12_4_ = fStack_13c;
                    auVar33 = divps(local_58,auVar8);
                    auVar6._4_8_ = auVar30._8_8_;
                    auVar6._0_4_ = extraout_XMM0_Db_02 * local_58._4_4_;
                    auVar31._0_8_ = auVar6._0_8_ << 0x20;
                    auVar31._8_4_ = local_108 * local_58._8_4_;
                    auVar31._12_4_ = fVar28 * local_58._12_4_;
                    auVar7._4_8_ = local_58._8_8_;
                    auVar7._0_4_ = fStack_44;
                    auVar34._0_8_ = auVar7._0_8_ << 0x20;
                    auVar34._8_4_ = fStack_40;
                    auVar34._12_4_ = fStack_3c;
                    auVar35._4_12_ = auVar34._4_12_;
                    auVar35._0_4_ = (float)(int)piVar20;
                    auVar32._8_8_ = auVar31._8_8_;
                    auVar32._0_8_ = auVar33._0_8_;
                    local_188._12_4_ = (auVar33._0_4_ + auVar35._0_4_) * (float)local_78._0_4_;
                    local_188._16_4_ = (auVar33._4_4_ + fStack_44) * (float)local_78._4_4_;
                    auVar33 = divps(auVar32,auVar35);
                    fVar28 = auVar33._8_4_ * (float)local_68._8_4_;
                    fVar36 = auVar33._12_4_ * fStack_5c;
                    local_188._4_4_ = (float)local_188._12_4_ - fVar28;
                    local_188._8_4_ = (float)local_188._16_4_ - fVar36;
                    local_188._12_4_ = (float)local_188._12_4_ + fVar28;
                    local_188._16_4_ = (float)local_188._16_4_ + fVar36;
                    local_188._20_4_ = auVar33._8_4_ * auVar33._12_4_;
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)((long)local_1b8 + local_190 * 0x18);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_188._24_4_ = uVar21;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,(BBoxRect *)local_188);
                      pfVar18 = local_90;
                    }
                    else {
                      (__position._M_current)->xmax = (float)local_188._12_4_;
                      (__position._M_current)->ymax = (float)local_188._16_4_;
                      (__position._M_current)->area = (float)local_188._20_4_;
                      (__position._M_current)->label = uVar21;
                      (__position._M_current)->score = (float)local_f8._0_4_;
                      (__position._M_current)->xmin = (float)local_188._4_4_;
                      (__position._M_current)->ymin = (float)local_188._8_4_;
                      (__position._M_current)->xmax = (float)local_188._12_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                      pfVar18 = local_90;
                    }
                  }
                  pfVar27 = pfVar27 + 1;
                  pfVar19 = pfVar19 + 1;
                  local_120 = local_120 + 1;
                  local_118 = (pointer)((long)&local_118->data + 4);
                  pfVar18 = pfVar18 + 1;
                  piVar20 = (pointer)((long)piVar20 + 1);
                  this_02 = local_110;
                } while (piVar20 != local_128);
              }
              piVar20 = (pointer)((long)local_a0 + 1);
            } while (piVar20 != local_130);
            iVar16 = this_02->num_box;
          }
          local_190 = local_190 + 1;
        } while (local_190 < iVar16);
        if (0 < iVar16) {
          lVar26 = 8;
          lVar24 = 0;
          do {
            std::
            vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                      ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                        *)local_168,local_168._8_8_,*(undefined8 *)((long)local_1b8 + lVar26 + -8),
                       *(undefined8 *)
                        ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                   *)local_1b8)->_M_impl).super__Vector_impl_data._M_start + lVar26)
                      );
            lVar24 = lVar24 + 1;
            lVar26 = lVar26 + 0x18;
          } while (lVar24 < this_02->num_box);
        }
      }
      this = (Yolov3DetectionOutput *)local_1b8;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                 *)local_1b8);
      local_198 = (void *)((long)local_198 + 1);
    } while (local_198 <
             (void *)(((long)(local_d0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_d0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7));
    if (local_168._0_8_ != local_168._8_8_) {
      this = this_02;
      qsort_descent_inplace
                (this_02,(vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          *)local_168,0,
                 (int)((ulong)(local_168._8_8_ - local_168._0_8_) >> 2) * -0x49249249 + -1);
    }
  }
  local_188._0_4_ = 0.0;
  local_188._4_4_ = 0.0;
  local_188._8_4_ = 0.0;
  local_188._12_4_ = 0.0;
  local_188._16_4_ = 0.0;
  local_188._20_4_ = 0.0;
  nms_sorted_bboxes(this,(vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          *)local_168,
                    (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188,
                    this_02->nms_threshold);
  local_1b8 = (undefined1  [8])0x0;
  pBStack_1b0 = (BBoxRect *)0x0;
  local_1a8 = (BBoxRect *)0x0;
  lVar26 = CONCAT44(local_188._4_4_,local_188._0_4_);
  lVar24 = CONCAT44(local_188._12_4_,local_188._8_4_);
  if (lVar24 == lVar26) {
    iVar16 = 0;
  }
  else {
    uVar25 = 0;
    do {
      __args = (BBoxRect *)(local_168._0_8_ + *(long *)(lVar26 + uVar25 * 8) * 0x1c);
      if (pBStack_1b0 == local_1a8) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)local_1b8,(iterator)pBStack_1b0,__args);
        lVar26 = CONCAT44(local_188._4_4_,local_188._0_4_);
        lVar24 = CONCAT44(local_188._12_4_,local_188._8_4_);
      }
      else {
        fVar9 = __args->score;
        fVar10 = __args->xmin;
        fVar11 = __args->ymin;
        fVar12 = __args->xmax;
        fVar28 = __args->ymax;
        fVar36 = __args->area;
        iVar16 = __args->label;
        pBStack_1b0->xmax = __args->xmax;
        pBStack_1b0->ymax = fVar28;
        pBStack_1b0->area = fVar36;
        pBStack_1b0->label = iVar16;
        pBStack_1b0->score = fVar9;
        pBStack_1b0->xmin = fVar10;
        pBStack_1b0->ymin = fVar11;
        pBStack_1b0->xmax = fVar12;
        pBStack_1b0 = pBStack_1b0 + 1;
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 < (ulong)(lVar24 - lVar26 >> 3));
    _h = (int)((long)pBStack_1b0 - (long)local_1b8 >> 2) * -0x49249249;
    iVar16 = 0;
    if (_h != 0) {
      this_01 = (local_e0->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_01,6,_h,4,local_d8->blob_allocator);
      iVar16 = -100;
      if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
         (iVar16 = 0, 0 < (int)_h)) {
        iVar14 = this_01->w;
        sVar2 = this_01->elemsize;
        puVar15 = (undefined4 *)((long)this_01->data + 0x14);
        iVar16 = 0;
        lVar26 = 0;
        do {
          uVar21 = *(undefined4 *)
                    ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               *)local_1b8)->_M_impl).super__Vector_impl_data._M_start + lVar26);
          puVar15[-5] = (float)*(int *)((long)&(((pointer)((long)local_1b8 + 0x18))->
                                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                               )._M_impl.super__Vector_impl_data._M_start + lVar26)
                        + 1.0;
          puVar15[-4] = uVar21;
          puVar15[-3] = *(undefined4 *)
                         ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                    *)local_1b8)->_M_impl).super__Vector_impl_data._M_start +
                         lVar26 + 4);
          puVar15[-2] = *(undefined4 *)
                         ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                    *)local_1b8)->_M_impl).super__Vector_impl_data._M_finish +
                         lVar26);
          puVar15[-1] = *(undefined4 *)
                         ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                    *)local_1b8)->_M_impl).super__Vector_impl_data._M_finish +
                         lVar26 + 4);
          *puVar15 = *(undefined4 *)
                      ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 *)local_1b8)->_M_impl).super__Vector_impl_data._M_end_of_storage +
                      lVar26);
          lVar26 = lVar26 + 0x1c;
          puVar15 = (undefined4 *)((long)puVar15 + (long)iVar14 * sVar2);
        } while ((ulong)(_h & 0x7fffffff) * 0x1c != lVar26);
      }
    }
  }
  if (local_1b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b8,(long)local_1a8 - (long)local_1b8);
  }
  pvVar3 = (void *)CONCAT44(local_188._4_4_,local_188._0_4_);
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,CONCAT44(local_188._20_4_,local_188._16_4_) - (long)pvVar3);
  }
LAB_00448ff4:
  if ((pointer)local_168._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_168._0_8_,local_168._16_8_ - local_168._0_8_);
  }
  return iVar16;
}

Assistant:

int Yolov3DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
        //printf("%d %d\n", net_w, net_h);

        //printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + expf(-box_score_ptr[0]) * (1.f + expf(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = expf(wptr[0]) * bias_w / net_w;
                        float bbox_h = expf(hptr[0]) * bias_h / net_h;

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = r.label + 1.0f; // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}